

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::isEarHashed(Earcut<unsigned_int> *this,Node *ear)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  bool bVar8;
  int32_t iVar9;
  int32_t iVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  pNVar5 = ear->prev;
  pNVar6 = ear->next;
  dVar3 = ear->x;
  dVar4 = ear->y;
  dVar16 = pNVar5->x;
  dVar17 = pNVar5->y;
  dVar19 = pNVar6->x;
  dVar18 = pNVar6->y;
  if (0.0 <= (dVar19 - dVar3) * (dVar4 - dVar17) - (dVar18 - dVar4) * (dVar3 - dVar16)) {
LAB_003a2be8:
    bVar8 = false;
  }
  else {
    pdVar1 = &pNVar6->x;
    pdVar2 = &ear->x;
    pdVar15 = &pNVar5->x;
    dVar20 = dVar19;
    pdVar12 = pdVar1;
    if (dVar3 <= dVar19) {
      dVar20 = dVar3;
      pdVar12 = pdVar2;
    }
    if (dVar16 <= dVar20) {
      pdVar12 = pdVar15;
    }
    dVar20 = dVar18;
    pdVar13 = &pNVar6->y;
    if (dVar4 <= dVar18) {
      dVar20 = dVar4;
      pdVar13 = &ear->y;
    }
    if (dVar17 <= dVar20) {
      pdVar13 = &pNVar5->y;
    }
    pdVar14 = pdVar1;
    if (dVar19 <= dVar3) {
      dVar19 = dVar3;
      pdVar14 = pdVar2;
    }
    if (dVar19 <= dVar16) {
      pdVar14 = pdVar15;
    }
    pdVar11 = &pNVar6->y;
    if (dVar18 <= dVar4) {
      pdVar11 = &ear->y;
    }
    dVar3 = *pdVar14;
    if (dVar18 <= dVar4) {
      dVar18 = dVar4;
    }
    if (dVar18 <= dVar17) {
      pdVar11 = &pNVar5->y;
    }
    dVar4 = *pdVar11;
    iVar9 = zOrder(this,*pdVar12,*pdVar13);
    iVar10 = zOrder(this,dVar3,dVar4);
    for (pNVar7 = ear->nextZ; (pNVar7 != (Node *)0x0 && (pNVar7->z <= iVar10));
        pNVar7 = pNVar7->nextZ) {
      if ((pNVar7 != ear->prev) && (pNVar7 != ear->next)) {
        dVar3 = pNVar7->x;
        dVar4 = pNVar7->y;
        dVar16 = pNVar6->y - dVar4;
        dVar17 = pNVar5->y - dVar4;
        if ((*pdVar15 - dVar3) * dVar16 <= dVar17 * (*pdVar1 - dVar3)) {
          dVar19 = ear->y - dVar4;
          if (((dVar17 * (*pdVar2 - dVar3) <= (*pdVar15 - dVar3) * dVar19) &&
              ((*pdVar1 - dVar3) * dVar19 <= dVar16 * (*pdVar2 - dVar3))) &&
             (0.0 <= (pNVar7->next->x - dVar3) * (dVar4 - pNVar7->prev->y) -
                     (pNVar7->next->y - dVar4) * (dVar3 - pNVar7->prev->x))) goto LAB_003a2be8;
        }
      }
    }
    bVar8 = true;
    for (pNVar7 = ear->prevZ; (pNVar7 != (Node *)0x0 && (iVar9 <= pNVar7->z));
        pNVar7 = pNVar7->prevZ) {
      if ((pNVar7 != ear->prev) && (pNVar7 != ear->next)) {
        dVar3 = pNVar7->x;
        dVar4 = pNVar7->y;
        dVar16 = pNVar6->y - dVar4;
        dVar17 = pNVar5->y - dVar4;
        if ((*pdVar15 - dVar3) * dVar16 <= dVar17 * (*pdVar1 - dVar3)) {
          dVar19 = ear->y - dVar4;
          if (((dVar17 * (*pdVar2 - dVar3) <= (*pdVar15 - dVar3) * dVar19) &&
              ((*pdVar1 - dVar3) * dVar19 <= dVar16 * (*pdVar2 - dVar3))) &&
             (0.0 <= (pNVar7->next->x - dVar3) * (dVar4 - pNVar7->prev->y) -
                     (pNVar7->next->y - dVar4) * (dVar3 - pNVar7->prev->x))) goto LAB_003a2be8;
        }
      }
    }
  }
  return bVar8;
}

Assistant:

bool Earcut<N>::isEarHashed(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // triangle bbox; min & max are calculated like this for speed
    const double minTX = std::min<double>(a->x, std::min<double>(b->x, c->x));
    const double minTY = std::min<double>(a->y, std::min<double>(b->y, c->y));
    const double maxTX = std::max<double>(a->x, std::max<double>(b->x, c->x));
    const double maxTY = std::max<double>(a->y, std::max<double>(b->y, c->y));

    // z-order range for the current triangle bbox;
    const int32_t minZ = zOrder(minTX, minTY);
    const int32_t maxZ = zOrder(maxTX, maxTY);

    // first look for points inside the triangle in increasing z-order
    Node* p = ear->nextZ;

    while (p && p->z <= maxZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->nextZ;
    }

    // then look for points in decreasing z-order
    p = ear->prevZ;

    while (p && p->z >= minZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->prevZ;
    }

    return true;
}